

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

bool __thiscall
pybind11::detail::type_caster<bool,_void>::load
          (type_caster<bool,_void> *this,handle src,bool convert)

{
  PyNumberMethods *pPVar1;
  inquiry p_Var2;
  bool bVar3;
  int iVar4;
  PyObject **ppPVar5;
  PyNumberMethods *tp_as_number;
  Py_ssize_t res;
  bool convert_local;
  type_caster<bool,_void> *this_local;
  handle src_local;
  
  this_local = (type_caster<bool,_void> *)src.m_ptr;
  bVar3 = handle::operator_cast_to_bool((handle *)&this_local);
  if (!bVar3) {
    return false;
  }
  ppPVar5 = handle::ptr((handle *)&this_local);
  if (*ppPVar5 == (PyObject *)&_Py_TrueStruct) {
    this->value = true;
    return true;
  }
  ppPVar5 = handle::ptr((handle *)&this_local);
  if (*ppPVar5 == (PyObject *)&_Py_FalseStruct) {
    this->value = false;
    return true;
  }
  if (!convert) {
    ppPVar5 = handle::ptr((handle *)&this_local);
    iVar4 = strcmp("numpy.bool_",(*ppPVar5)->ob_type->tp_name);
    if (iVar4 != 0) {
      return false;
    }
  }
  tp_as_number = (PyNumberMethods *)0xffffffffffffffff;
  bVar3 = object_api<pybind11::handle>::is_none((object_api<pybind11::handle> *)&this_local);
  if (bVar3) {
    tp_as_number = (PyNumberMethods *)0x0;
  }
  else {
    ppPVar5 = handle::ptr((handle *)&this_local);
    pPVar1 = (*ppPVar5)->ob_type->tp_as_number;
    if ((pPVar1 != (PyNumberMethods *)0x0) && (pPVar1->nb_bool != (inquiry)0x0)) {
      p_Var2 = pPVar1->nb_bool;
      ppPVar5 = handle::ptr((handle *)&this_local);
      iVar4 = (*p_Var2)(*ppPVar5);
      tp_as_number = (PyNumberMethods *)(long)iVar4;
    }
  }
  if ((tp_as_number != (PyNumberMethods *)0x0) && (tp_as_number != (PyNumberMethods *)0x1)) {
    return false;
  }
  this->value = tp_as_number != (PyNumberMethods *)0x0;
  return true;
}

Assistant:

bool load(handle src, bool convert) {
        if (!src) return false;
        else if (src.ptr() == Py_True) { value = true; return true; }
        else if (src.ptr() == Py_False) { value = false; return true; }
        else if (convert || !strcmp("numpy.bool_", Py_TYPE(src.ptr())->tp_name)) {
            // (allow non-implicit conversion for numpy booleans)

            Py_ssize_t res = -1;
            if (src.is_none()) {
                res = 0;  // None is implicitly converted to False
            }
            #if defined(PYPY_VERSION)
            // On PyPy, check that "__bool__" (or "__nonzero__" on Python 2.7) attr exists
            else if (hasattr(src, PYBIND11_BOOL_ATTR)) {
                res = PyObject_IsTrue(src.ptr());
            }
            #else
            // Alternate approach for CPython: this does the same as the above, but optimized
            // using the CPython API so as to avoid an unneeded attribute lookup.
            else if (auto tp_as_number = src.ptr()->ob_type->tp_as_number) {
                if (PYBIND11_NB_BOOL(tp_as_number)) {
                    res = (*PYBIND11_NB_BOOL(tp_as_number))(src.ptr());
                }
            }
            #endif
            if (res == 0 || res == 1) {
                value = (bool) res;
                return true;
            }
        }
        return false;
    }